

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O1

void Imath_2_5::jacobiSVD<double>
               (Matrix33<double> *A,Matrix33<double> *U,Vec3<double> *S,Matrix33<double> *V,
               double tol,bool forcePositiveDeterminant)

{
  long lVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  uint uVar12;
  int i;
  long lVar13;
  int iVar14;
  double *pdVar15;
  long lVar16;
  double *pdVar17;
  bool bVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double __tmp;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double z;
  double local_f8;
  double dStack_e0;
  double dStack_80;
  double local_58;
  double dStack_50;
  
  dVar28 = A->x[0][0];
  dVar21 = A->x[0][1];
  dVar23 = A->x[0][2];
  dVar22 = A->x[1][0];
  dVar29 = A->x[1][1];
  dVar32 = A->x[1][2];
  dVar27 = A->x[2][0];
  dVar31 = A->x[2][1];
  dVar19 = A->x[2][2];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar19;
  U->x[0][0] = 0.0;
  U->x[0][1] = 0.0;
  U->x[1][1] = 0.0;
  U->x[1][2] = 0.0;
  U->x[2][0] = 0.0;
  U->x[2][1] = 0.0;
  U->x[0][2] = 0.0;
  U->x[1][0] = 0.0;
  U->x[0][0] = 1.0;
  U->x[1][1] = 1.0;
  U->x[2][2] = 1.0;
  V->x[0][0] = 0.0;
  V->x[0][1] = 0.0;
  V->x[1][1] = 0.0;
  V->x[1][2] = 0.0;
  V->x[2][0] = 0.0;
  V->x[2][1] = 0.0;
  V->x[0][2] = 0.0;
  V->x[1][0] = 0.0;
  V->x[0][0] = 1.0;
  V->x[1][1] = 1.0;
  V->x[2][2] = 1.0;
  dVar34 = ABS(dVar21);
  if (dVar34 <= 0.0) {
    dVar34 = 0.0;
  }
  dVar26 = ABS(dVar23);
  if (ABS(dVar23) <= dVar34) {
    dVar26 = dVar34;
  }
  dVar34 = ABS(dVar22);
  if (ABS(dVar22) <= dVar26) {
    dVar34 = dVar26;
  }
  dVar26 = ABS(dVar32);
  if (ABS(dVar32) <= dVar34) {
    dVar26 = dVar34;
  }
  dVar34 = ABS(dVar27);
  if (ABS(dVar27) <= dVar26) {
    dVar34 = dVar26;
  }
  dVar26 = ABS(dVar31);
  if (ABS(dVar31) <= dVar34) {
    dVar26 = dVar34;
  }
  dVar26 = dVar26 * tol;
  if ((dVar26 != 0.0) || (NAN(dVar26))) {
    local_58 = 0.0;
    dStack_50 = 1.0;
    uVar12 = 0;
    do {
      bVar18 = ABS(dVar29 + dVar28) * tol < ABS(dVar21 - dVar22);
      if (bVar18) {
        dVar34 = (dVar29 + dVar28) / (dVar21 - dVar22);
        dVar19 = dVar34 * dVar34 + 1.0;
        if (dVar19 < 0.0) {
          dVar19 = sqrt(dVar19);
        }
        else {
          dVar19 = SQRT(dVar19);
        }
        dVar35 = (double)((ulong)-(1.0 / dVar19) & -(ulong)(dVar34 < 0.0) |
                         ~-(ulong)(dVar34 < 0.0) & (ulong)(1.0 / dVar19));
        dVar34 = dVar34 * dVar35;
        dVar19 = (dVar22 + dVar21) * dVar35 + (dVar29 - dVar28) * dVar34;
        dVar20 = dVar34 * dVar21 - dVar35 * dVar29;
        dVar20 = dVar20 + dVar20;
      }
      else {
        dVar19 = dVar29 - dVar28;
        dVar20 = dVar22 + dVar21;
        dVar35 = 0.0;
        dVar34 = 1.0;
      }
      dVar24 = 1.0;
      dVar25 = 0.0;
      if (ABS(dVar19) * tol < ABS(dVar20)) {
        dVar19 = dVar19 / dVar20;
        dVar20 = dVar19 * dVar19 + 1.0;
        if (dVar20 < 0.0) {
          dVar20 = sqrt(dVar20);
        }
        else {
          dVar20 = SQRT(dVar20);
        }
        dVar20 = 1.0 / (ABS(dVar19) + dVar20);
        dVar25 = (double)((ulong)-dVar20 & -(ulong)(dVar19 < 0.0) |
                         ~-(ulong)(dVar19 < 0.0) & (ulong)dVar20);
        dVar24 = dVar25 * dVar25 + 1.0;
        if (dVar24 < 0.0) {
          dVar24 = sqrt(dVar24);
        }
        else {
          dVar24 = SQRT(dVar24);
        }
        dVar24 = 1.0 / dVar24;
        dVar25 = dVar25 * dVar24;
        bVar18 = true;
      }
      if (bVar18) {
        dVar20 = dVar25 * dVar34 + dVar35 * dVar24;
        dVar19 = dVar34 * dVar24 + dVar35 * -dVar25;
        dVar34 = dVar31 * -dVar25;
        dVar35 = dVar32 * -dVar20;
        lVar13 = 0;
        do {
          dVar33 = *(double *)((long)U->x[0] + lVar13);
          dVar2 = *(double *)((long)U->x[0] + lVar13 + 8);
          pdVar15 = (double *)((long)U->x[0] + lVar13);
          *pdVar15 = dVar33 * dVar19 + -dVar2 * dVar20;
          pdVar15[1] = dVar33 * dVar20 + dVar2 * dVar19;
          lVar13 = lVar13 + 0x18;
        } while (lVar13 != 0x48);
        dVar33 = dVar28 * dVar25;
        lVar13 = 0;
        do {
          dVar2 = *(double *)((long)V->x[0] + lVar13);
          dVar3 = *(double *)((long)V->x[0] + lVar13 + 8);
          dVar9 = dVar2 * dVar25 + dVar3 * dVar24;
          auVar7._8_4_ = SUB84(dVar9,0);
          auVar7._0_8_ = dVar2 * dVar24 + -dVar3 * dVar25;
          auVar7._12_4_ = (int)((ulong)dVar9 >> 0x20);
          *(undefined1 (*) [16])((long)V->x[0] + lVar13) = auVar7;
          lVar13 = lVar13 + 0x18;
        } while (lVar13 != 0x48);
        dVar28 = dVar19 * (dVar28 * dVar24 + -dVar21 * dVar25) +
                 -dVar20 * (dVar22 * dVar24 + -dVar29 * dVar25);
        dVar29 = dVar20 * (dVar33 + dVar21 * dVar24) + dVar19 * (dVar22 * dVar25 + dVar29 * dVar24);
        dVar31 = dVar31 * dVar24 + dVar25 * dVar27;
        dVar32 = dVar32 * dVar19 + dVar20 * dVar23;
        dVar27 = dVar24 * dVar27 + dVar34;
        dVar23 = dVar19 * dVar23 + dVar35;
      }
      dVar19 = auVar30._0_8_;
      bVar4 = ABS(dVar19 + dVar28) * tol < ABS(dVar23 - dVar27);
      if (bVar4) {
        dVar20 = (dVar19 + dVar28) / (dVar23 - dVar27);
        dVar21 = dVar20 * dVar20 + 1.0;
        if (dVar21 < 0.0) {
          dVar21 = sqrt(dVar21);
        }
        else {
          dVar21 = SQRT(dVar21);
        }
        dVar34 = (double)((ulong)-(1.0 / dVar21) & -(ulong)(dVar20 < 0.0) |
                         ~-(ulong)(dVar20 < 0.0) & (ulong)(1.0 / dVar21));
        dVar20 = dVar20 * dVar34;
        dVar21 = (dVar27 + dVar23) * dVar34 + (dVar19 - dVar28) * dVar20;
        dVar22 = dVar20 * dVar23 - dVar34 * dVar19;
        dVar22 = dVar22 + dVar22;
      }
      else {
        dVar21 = dVar19 - dVar28;
        dVar22 = dVar27 + dVar23;
        dVar34 = 0.0;
        dVar20 = 1.0;
      }
      dVar35 = local_58;
      dVar24 = dStack_50;
      if (ABS(dVar21) * tol < ABS(dVar22)) {
        dVar21 = dVar21 / dVar22;
        dVar22 = dVar21 * dVar21 + 1.0;
        if (dVar22 < 0.0) {
          dVar22 = sqrt(dVar22);
        }
        else {
          dVar22 = SQRT(dVar22);
        }
        dVar22 = 1.0 / (ABS(dVar21) + dVar22);
        dVar35 = (double)((ulong)-dVar22 & -(ulong)(dVar21 < 0.0) |
                         ~-(ulong)(dVar21 < 0.0) & (ulong)dVar22);
        dVar24 = dVar35 * dVar35 + 1.0;
        if (dVar24 < 0.0) {
          dVar24 = sqrt(dVar24);
        }
        else {
          dVar24 = SQRT(dVar24);
        }
        dVar24 = 1.0 / dVar24;
        dVar35 = dVar35 * dVar24;
        bVar4 = true;
      }
      dVar21 = 0.0;
      dVar22 = 0.0;
      if (bVar4) {
        dVar25 = dVar35 * dVar20 + dVar34 * dVar24;
        dVar33 = -dVar19;
        dVar34 = dVar24 * dVar20 + -dVar35 * dVar34;
        lVar13 = 0x10;
        do {
          dVar21 = *(double *)((long)(U->x + -1) + 8 + lVar13);
          dVar22 = *(double *)((long)U->x[0] + lVar13);
          *(double *)((long)(U->x + -1) + 8 + lVar13) = dVar34 * dVar21 - dVar25 * dVar22;
          *(double *)((long)U->x[0] + lVar13) = dVar21 * dVar25 + dVar22 * dVar34;
          lVar13 = lVar13 + 0x18;
        } while (lVar13 != 0x58);
        dVar21 = dVar34 * 0.0 + -dVar25 * dVar31;
        dVar22 = dVar24 * 0.0 + -dVar35 * dVar32;
        lVar13 = 0x10;
        do {
          dVar20 = *(double *)((long)(V->x + -1) + 8 + lVar13);
          dVar2 = *(double *)((long)V->x[0] + lVar13);
          *(double *)((long)(V->x + -1) + 8 + lVar13) = dVar24 * dVar20 - dVar35 * dVar2;
          *(double *)((long)V->x[0] + lVar13) = dVar20 * dVar35 + dVar2 * dVar24;
          lVar13 = lVar13 + 0x18;
        } while (lVar13 != 0x58);
        dVar19 = dVar25 * (dVar28 * dVar35 + dVar23 * dVar24) +
                 dVar34 * (dVar27 * dVar35 + dVar19 * dVar24);
        dVar28 = dVar34 * (dVar28 * dVar24 + -dVar23 * dVar35) +
                 -dVar25 * (dVar27 * dVar24 + dVar33 * dVar35);
        dVar31 = dVar31 * dVar34 + dVar25 * 0.0;
        dVar32 = dVar32 * dVar24 + dVar35 * 0.0;
      }
      bVar5 = ABS(dVar29 + dVar19) * tol < ABS(dVar32 - dVar31);
      auVar8._8_4_ = SUB84(dVar28,0);
      auVar8._0_8_ = dVar19;
      auVar8._12_4_ = (int)((ulong)dVar28 >> 0x20);
      auVar10._8_4_ = SUB84(dVar29,0);
      auVar10._0_8_ = dVar29;
      auVar10._12_4_ = (int)((ulong)dVar29 >> 0x20);
      dStack_e0 = auVar8._8_8_;
      if (bVar5) {
        local_f8 = (dVar29 + dVar19) / (dVar32 - dVar31);
        dVar23 = local_f8 * local_f8 + 1.0;
        if (dVar23 < 0.0) {
          dVar23 = sqrt(dVar23);
          dVar28 = dStack_e0;
        }
        else {
          dVar23 = SQRT(dVar23);
        }
        dVar34 = (double)((ulong)-(1.0 / dVar23) & -(ulong)(local_f8 < 0.0) |
                         ~-(ulong)(local_f8 < 0.0) & (ulong)(1.0 / dVar23));
        local_f8 = local_f8 * dVar34;
        dVar27 = (dVar31 + dVar32) * dVar34 + (dVar19 - dVar29) * local_f8;
        dVar23 = local_f8 * dVar32 - dVar34 * dVar19;
        dVar23 = dVar23 + dVar23;
      }
      else {
        dVar27 = dVar19 - dVar29;
        dVar23 = dVar31 + dVar32;
        dVar34 = 0.0;
        local_f8 = 1.0;
      }
      dVar20 = 1.0;
      dVar35 = 0.0;
      if (ABS(dVar27) * tol < ABS(dVar23)) {
        dVar27 = dVar27 / dVar23;
        dVar28 = dVar27 * dVar27 + 1.0;
        if (dVar28 < 0.0) {
          dVar28 = sqrt(dVar28);
        }
        else {
          dVar28 = SQRT(dVar28);
        }
        dVar28 = 1.0 / (ABS(dVar27) + dVar28);
        dVar35 = (double)((ulong)-dVar28 & -(ulong)(dVar27 < 0.0) |
                         ~-(ulong)(dVar27 < 0.0) & (ulong)dVar28);
        dVar20 = dVar35 * dVar35 + 1.0;
        if (dVar20 < 0.0) {
          dVar20 = sqrt(dVar20);
        }
        else {
          dVar20 = SQRT(dVar20);
        }
        dVar20 = 1.0 / dVar20;
        dVar35 = dVar35 * dVar20;
        bVar5 = true;
        dVar28 = dStack_e0;
      }
      dVar23 = 0.0;
      dVar27 = 0.0;
      if (bVar5) {
        dVar28 = local_f8 * dVar20 + -dVar35 * dVar34;
        dVar34 = local_f8 * dVar35 + dVar20 * dVar34;
        lVar13 = 0;
        do {
          dVar23 = *(double *)((long)U->x[0] + lVar13 + 8);
          dVar27 = *(double *)((long)U->x[0] + lVar13 + 0x10);
          pdVar15 = (double *)((long)U->x[0] + lVar13 + 8);
          *pdVar15 = dVar23 * dVar28 + dVar34 * -dVar27;
          pdVar15[1] = dVar23 * dVar34 + dVar28 * dVar27;
          lVar13 = lVar13 + 0x18;
        } while (lVar13 != 0x48);
        dStack_80 = auVar10._8_8_;
        lVar13 = 0;
        do {
          dVar23 = *(double *)((long)V->x[0] + lVar13 + 8);
          dVar27 = *(double *)((long)V->x[0] + lVar13 + 0x10);
          pdVar15 = (double *)((long)V->x[0] + lVar13 + 8);
          *pdVar15 = dVar23 * dVar20 + -dVar27 * dVar35;
          pdVar15[1] = dVar23 * dVar35 + dVar27 * dVar20;
          lVar13 = lVar13 + 0x18;
        } while (lVar13 != 0x48);
        dVar29 = dVar28 * (dVar29 * dVar20 + -dVar32 * dVar35) +
                 -dVar34 * (dVar31 * dVar20 + -dVar19 * dVar35);
        dVar19 = dVar34 * (dStack_80 * dVar35 + dVar32 * dVar20) +
                 dVar28 * (dVar31 * dVar35 + dVar19 * dVar20);
        dVar23 = dVar35 * dVar21 + dVar20 * 0.0;
        dVar27 = dVar34 * dVar22 + dVar28 * 0.0;
        dVar21 = dVar20 * dVar21 + dVar35 * -0.0;
        dVar22 = dVar28 * dVar22 + dVar34 * -0.0;
        dVar28 = dStack_e0;
      }
      if (!(bool)(bVar18 | bVar4 | bVar5)) break;
      dVar32 = ABS(dVar21);
      if (dVar32 <= 0.0) {
        dVar32 = 0.0;
      }
      dVar31 = ABS(dVar23);
      if (ABS(dVar23) <= dVar32) {
        dVar31 = dVar32;
      }
      dVar32 = ABS(dVar22);
      if (ABS(dVar22) <= dVar31) {
        dVar32 = dVar31;
      }
      dVar31 = ABS(dVar27);
      if (ABS(dVar27) <= dVar32) {
        dVar31 = dVar32;
      }
      if (dVar31 <= dVar26) break;
      auVar30._8_8_ = dVar19;
      auVar30._0_8_ = dVar19;
      dVar31 = 0.0;
      dVar32 = 0.0;
      bVar18 = uVar12 < 0x13;
      uVar12 = uVar12 + 1;
    } while (bVar18);
  }
  S->x = dVar28;
  auVar6._8_4_ = SUB84(dVar19,0);
  auVar6._0_8_ = dVar29;
  auVar6._12_4_ = (int)((ulong)dVar19 >> 0x20);
  S->y = dVar29;
  S->z = (double)auVar6._8_8_;
  lVar13 = 0;
  pdVar15 = (double *)U;
  do {
    if ((&S->x)[lVar13] < 0.0) {
      (&S->x)[lVar13] = -(&S->x)[lVar13];
      lVar16 = 0;
      do {
        *(ulong *)((long)pdVar15 + lVar16) = *(ulong *)((long)pdVar15 + lVar16) ^ 0x8000000000000000
        ;
        lVar16 = lVar16 + 0x18;
      } while (lVar16 != 0x48);
    }
    lVar13 = lVar13 + 1;
    pdVar15 = pdVar15 + 1;
  } while (lVar13 != 3);
  lVar13 = 2;
  iVar14 = 0;
  do {
    pdVar15 = (double *)V;
    pdVar17 = (double *)U;
    lVar16 = 0;
    do {
      dVar28 = (&S->x)[lVar16];
      lVar1 = lVar16 + 1;
      if (dVar28 < (&S->y)[lVar16]) {
        (&S->x)[lVar16] = (&S->y)[lVar16];
        (&S->y)[lVar16] = dVar28;
        lVar16 = 0;
        do {
          uVar11 = *(undefined8 *)((long)pdVar17 + lVar16);
          *(undefined8 *)((long)pdVar17 + lVar16) = ((undefined8 *)((long)pdVar17 + lVar16))[1];
          ((undefined8 *)((long)pdVar17 + lVar16))[1] = uVar11;
          lVar16 = lVar16 + 0x18;
        } while (lVar16 != 0x48);
        lVar16 = 0;
        do {
          uVar11 = *(undefined8 *)((long)pdVar15 + lVar16);
          *(undefined8 *)((long)pdVar15 + lVar16) = ((undefined8 *)((long)pdVar15 + lVar16))[1];
          ((undefined8 *)((long)pdVar15 + lVar16))[1] = uVar11;
          lVar16 = lVar16 + 0x18;
        } while (lVar16 != 0x48);
      }
      pdVar17 = pdVar17 + 1;
      pdVar15 = pdVar15 + 1;
      lVar16 = lVar1;
    } while (lVar1 != lVar13);
    lVar13 = lVar13 + -1;
    bVar18 = iVar14 == 0;
    iVar14 = iVar14 + 1;
  } while (bVar18);
  if (forcePositiveDeterminant) {
    dVar28 = U->x[1][0];
    dVar21 = U->x[1][1];
    dVar23 = U->x[2][2];
    dVar22 = U->x[1][2];
    dVar29 = U->x[2][1];
    dVar32 = U->x[2][0];
    if ((dVar28 * dVar29 - dVar32 * dVar21) * U->x[0][2] +
        (dVar21 * dVar23 - dVar29 * dVar22) * U->x[0][0] +
        (dVar22 * dVar32 - dVar23 * dVar28) * U->x[0][1] < 0.0) {
      lVar13 = 0x10;
      do {
        *(ulong *)((long)U->x[0] + lVar13) = *(ulong *)((long)U->x[0] + lVar13) ^ 0x8000000000000000
        ;
        lVar13 = lVar13 + 0x18;
      } while (lVar13 != 0x58);
      S->z = -S->z;
    }
    dVar28 = V->x[1][0];
    dVar21 = V->x[1][1];
    dVar23 = V->x[2][2];
    dVar22 = V->x[1][2];
    dVar29 = V->x[2][1];
    dVar32 = V->x[2][0];
    if ((dVar28 * dVar29 - dVar32 * dVar21) * V->x[0][2] +
        (dVar21 * dVar23 - dVar29 * dVar22) * V->x[0][0] +
        (dVar22 * dVar32 - dVar23 * dVar28) * V->x[0][1] < 0.0) {
      lVar13 = 0x10;
      do {
        *(ulong *)((long)V->x[0] + lVar13) = *(ulong *)((long)V->x[0] + lVar13) ^ 0x8000000000000000
        ;
        lVar13 = lVar13 + 0x18;
      } while (lVar13 != 0x58);
      S->z = -S->z;
    }
  }
  return;
}

Assistant:

void
jacobiSVD (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A,
           IMATH_INTERNAL_NAMESPACE::Matrix33<T>& U,
           IMATH_INTERNAL_NAMESPACE::Vec3<T>& S,
           IMATH_INTERNAL_NAMESPACE::Matrix33<T>& V,
           const T tol,
           const bool forcePositiveDeterminant)
{
    twoSidedJacobiSVD (A, U, S, V, tol, forcePositiveDeterminant);
}